

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_tree.cpp
# Opt level: O2

string * __thiscall
si9ma::BinaryTree::in_order_serial_abi_cxx11_
          (string *__return_storage_ptr__,BinaryTree *this,TreeNode *head)

{
  TreeNode *head_00;
  TreeNode *head_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  if (this == (BinaryTree *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"#_",(allocator *)&local_50);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::to_string(&local_30,*(int *)this);
    std::operator+(&local_50,&local_30,"_");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
    in_order_serial_abi_cxx11_(&local_50,*(BinaryTree **)(this + 8),head_00);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    in_order_serial_abi_cxx11_(&local_50,*(BinaryTree **)(this + 0x10),head_01);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

string BinaryTree::in_order_serial(const TreeNode *head) {
        if (head == nullptr)
            return "#_";

        string res;
        res += to_string(head->value) + "_";
        res += in_order_serial(head->left);
        res += in_order_serial(head->right);

        return res;
    }